

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O1

void __thiscall QAbstractSpinBox::setLineEdit(QAbstractSpinBox *this,QLineEdit *lineEdit)

{
  long *plVar1;
  QLineEdit *pQVar2;
  void **ppvVar3;
  void **ppvVar4;
  QWidget *this_00;
  int iVar5;
  QValidator *pQVar6;
  QStyle *pQVar7;
  undefined4 *puVar8;
  long in_FS_OFFSET;
  QObject local_88 [8];
  QObject local_80 [8];
  QObject local_78 [8];
  Connection local_70;
  QLineEdit *local_68;
  ImplFn local_60;
  code *local_58;
  undefined8 local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (lineEdit != (QLineEdit *)0x0) {
    plVar1 = *(long **)(this + 8);
    pQVar2 = (QLineEdit *)plVar1[0x6f];
    if (pQVar2 != lineEdit) {
      if (pQVar2 != (QLineEdit *)0x0) {
        (**(code **)(*(long *)&pQVar2->super_QWidget + 0x20))();
      }
      plVar1[0x6f] = (long)lineEdit;
      local_68 = lineEdit;
      if ((__atomic_base<int>)
          QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType.typeId._q_value.
          super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
        QMetaType::registerHelper(&QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType);
      }
      ::QVariant::moveConstruct
                ((QMetaTypeInterface *)&local_58,
                 &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType);
      QObject::doSetProperty((char *)this,(QVariant *)"_q_spinbox_lineedit",(QVariant *)&local_58);
      ::QVariant::~QVariant((QVariant *)&local_58);
      pQVar6 = QLineEdit::validator((QLineEdit *)plVar1[0x6f]);
      if (pQVar6 == (QValidator *)0x0) {
        QLineEdit::setValidator((QLineEdit *)plVar1[0x6f],(QValidator *)plVar1[0x70]);
      }
      if (*(QAbstractSpinBox **)(*(long *)&((QWidget *)plVar1[0x6f])->field_0x8 + 0x10) != this) {
        QWidget::setParent((QWidget *)plVar1[0x6f],(QWidget *)this);
      }
      pQVar2 = (QLineEdit *)plVar1[0x6f];
      pQVar7 = QWidget::style((QWidget *)this);
      iVar5 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x73,0,this,0);
      QLineEdit::setFrame(pQVar2,iVar5 == 0);
      QWidget::setFocusProxy((QWidget *)plVar1[0x6f],(QWidget *)this);
      QWidget::setAcceptDrops((QWidget *)plVar1[0x6f],false);
      if ((int)plVar1[0x71] != 0) {
        ppvVar3 = (void **)plVar1[0x6f];
        local_58 = QLineEdit::textChanged;
        local_50 = 0;
        local_68 = (QLineEdit *)QAbstractSpinBoxPrivate::editorTextChanged;
        local_60 = (ImplFn)0x0;
        ppvVar4 = (void **)plVar1[1];
        puVar8 = (undefined4 *)operator_new(0x20);
        *puVar8 = 1;
        *(code **)(puVar8 + 2) =
             QtPrivate::
             QPrivateSlotObject<void_(QAbstractSpinBoxPrivate::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
             ::impl;
        *(code **)(puVar8 + 4) = QAbstractSpinBoxPrivate::editorTextChanged;
        *(undefined8 *)(puVar8 + 6) = 0;
        QObject::connectImpl
                  ((QObject *)&local_70,ppvVar3,(QObject *)&local_58,ppvVar4,
                   (QSlotObjectBase *)&local_68,(ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0
                  );
        QMetaObject::Connection::~Connection(&local_70);
        ppvVar3 = (void **)plVar1[0x6f];
        local_58 = QLineEdit::cursorPositionChanged;
        local_50 = 0;
        local_68 = (QLineEdit *)0xe9;
        local_60 = (ImplFn)0x0;
        ppvVar4 = (void **)plVar1[1];
        puVar8 = (undefined4 *)operator_new(0x20);
        *puVar8 = 1;
        *(code **)(puVar8 + 2) =
             QtPrivate::
             QPrivateSlotObject<void_(QAbstractSpinBoxPrivate::*)(int,_int),_QtPrivate::List<int,_int>,_void>
             ::impl;
        *(undefined8 *)(puVar8 + 4) = 0xe9;
        *(undefined8 *)(puVar8 + 6) = 0;
        QObject::connectImpl
                  (local_78,ppvVar3,(QObject *)&local_58,ppvVar4,(QSlotObjectBase *)&local_68,
                   (ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
        QMetaObject::Connection::~Connection((Connection *)local_78);
        ppvVar3 = (void **)plVar1[0x6f];
        local_58 = QLineEdit::cursorPositionChanged;
        local_50 = 0;
        puVar8 = (undefined4 *)operator_new(0x18);
        *puVar8 = 1;
        *(code **)(puVar8 + 2) =
             QtPrivate::
             QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qabstractspinbox.cpp:711:23),_QtPrivate::List<>,_void>
             ::impl;
        *(QAbstractSpinBox **)(puVar8 + 4) = this;
        QObject::connectImpl
                  (local_80,ppvVar3,(QObject *)&local_58,(void **)this,(QSlotObjectBase *)0x0,
                   (ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
        QMetaObject::Connection::~Connection((Connection *)local_80);
        ppvVar3 = *(void ***)(*(long *)(plVar1[0x6f] + 8) + 600);
        local_58 = QWidgetLineControl::updateMicroFocus;
        local_50 = 0;
        puVar8 = (undefined4 *)operator_new(0x18);
        *puVar8 = 1;
        *(code **)(puVar8 + 2) =
             QtPrivate::
             QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/widgets/qabstractspinbox.cpp:713:23),_QtPrivate::List<>,_void>
             ::impl;
        *(QAbstractSpinBox **)(puVar8 + 4) = this;
        QObject::connectImpl
                  (local_88,ppvVar3,(QObject *)&local_58,(void **)this,(QSlotObjectBase *)0x0,
                   (ConnectionType)puVar8,(int *)0x0,(QMetaObject *)0x0);
        QMetaObject::Connection::~Connection((Connection *)local_88);
      }
      (**(code **)(*plVar1 + 0x100))(plVar1);
      QWidget::setContextMenuPolicy((QWidget *)plVar1[0x6f],NoContextMenu);
      this_00 = (QWidget *)plVar1[0x6f];
      *(QAbstractSpinBox **)(*(long *)(*(long *)&this_00->field_0x8 + 600) + 0x130) = this;
      if ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) != 0) {
        QWidget::show(this_00);
      }
      if ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) != 0) {
        (**(code **)(*plVar1 + 0xc0))(plVar1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBox::setLineEdit(QLineEdit *lineEdit)
{
    Q_D(QAbstractSpinBox);

    if (!lineEdit) {
        Q_ASSERT(lineEdit);
        return;
    }

    if (lineEdit == d->edit)
        return;

    delete d->edit;
    d->edit = lineEdit;
    setProperty("_q_spinbox_lineedit", QVariant::fromValue<QWidget *>(d->edit));
    if (!d->edit->validator())
        d->edit->setValidator(d->validator);

    if (d->edit->parent() != this)
        d->edit->setParent(this);

    d->edit->setFrame(!style()->styleHint(QStyle::SH_SpinBox_ButtonsInsideFrame, nullptr, this));
    d->edit->setFocusProxy(this);
    d->edit->setAcceptDrops(false);

    if (d->type != QMetaType::UnknownType) {
        QObjectPrivate::connect(d->edit, &QLineEdit::textChanged,
                                d, &QAbstractSpinBoxPrivate::editorTextChanged);
        QObjectPrivate::connect(d->edit, &QLineEdit::cursorPositionChanged,
                                d, &QAbstractSpinBoxPrivate::editorCursorPositionChanged);
        connect(d->edit, &QLineEdit::cursorPositionChanged,
                this, [this]() { updateMicroFocus(); });
        connect(d->edit->d_func()->control, &QWidgetLineControl::updateMicroFocus,
                this, [this]() { updateMicroFocus(); });
    }
    d->updateEditFieldGeometry();
    d->edit->setContextMenuPolicy(Qt::NoContextMenu);
    d->edit->d_func()->control->setAccessibleObject(this);

    if (isVisible())
        d->edit->show();
    if (isVisible())
        d->updateEdit();
}